

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O2

QString * QSqlQueryModelSql::leftJoin(QString *__return_storage_ptr__,QString *s)

{
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  latin1 = leftJoin();
  QString::QString((QString *)&QStack_38,latin1);
  concat(__return_storage_ptr__,(QString *)&QStack_38,s);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline const static QString leftJoin(const QString &s) { return concat(leftJoin(), s); }